

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O1

void funnelsort<32u,buffer_layout_bfs>(uchar **strings,size_t n,uchar **tmp)

{
  byte *pbVar1;
  byte *pbVar2;
  uchar *__s1;
  uchar *__s2;
  size_t n0;
  unsigned_long uVar3;
  int iVar4;
  uchar **ppuVar5;
  byte bVar6;
  byte bVar7;
  long lVar8;
  unsigned_long uVar9;
  uchar **ppuVar10;
  array<unsigned_long,_32UL> buffer_count;
  array<Stream,_32UL> streams;
  array<unsigned_char_*,_1692UL> buffers;
  fill<32U,_2U,_buffer_layout_bfs> local_3829;
  uchar **local_3828;
  uchar **local_3820;
  size_t local_3818;
  array<unsigned_long,_32UL> local_3810;
  array<Stream,_32UL> local_3710;
  uchar *local_3510 [8];
  undefined8 local_34d0 [8];
  undefined1 auStack_3490 [13408];
  
  if (n < 0x20) {
    ppuVar5 = strings;
    if (1 < (long)n) {
      do {
        iVar4 = (int)n;
        n = (size_t)(iVar4 - 1);
        pbVar1 = ppuVar5[1];
        for (ppuVar10 = ppuVar5 + 1; strings < ppuVar10; ppuVar10 = ppuVar10 + -1) {
          pbVar2 = ppuVar10[-1];
          bVar6 = *pbVar2;
          bVar7 = *pbVar1;
          if (bVar6 != 0 && bVar6 == bVar7) {
            lVar8 = 1;
            do {
              bVar6 = pbVar2[lVar8];
              bVar7 = pbVar1[lVar8];
              if (bVar6 == 0) break;
              lVar8 = lVar8 + 1;
            } while (bVar6 == bVar7);
          }
          if (bVar6 <= bVar7) break;
          *ppuVar10 = pbVar2;
        }
        *ppuVar10 = pbVar1;
        ppuVar5 = ppuVar5 + 1;
      } while (2 < iVar4);
    }
  }
  else {
    local_3710._M_elems[0].n = n >> 5;
    local_3710._M_elems[0].stream = strings;
    lVar8 = 0x18;
    do {
      *(size_t *)((long)local_3710._M_elems + lVar8 + -8) =
           *(long *)((long)local_3710._M_elems + lVar8 + -0x18) + local_3710._M_elems[0].n * 8;
      *(size_t *)((long)&local_3710._M_elems[0].stream + lVar8) = local_3710._M_elems[0].n;
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x1f8);
    local_3710._M_elems[0x1f].stream = local_3710._M_elems[0x1e].stream + local_3710._M_elems[0].n;
    local_3710._M_elems[0x1f].n = local_3710._M_elems[0].n * -0x1f + n;
    lVar8 = 8;
    local_3828 = strings;
    local_3818 = n;
    do {
      funnelsort<8u,buffer_layout_bfs>
                (*(uchar ***)((long)local_3710._M_elems + lVar8 + -8),
                 *(size_t *)((long)&local_3710._M_elems[0].stream + lVar8),tmp);
      check_input(*(uchar ***)((long)local_3710._M_elems + lVar8 + -8),
                  *(size_t *)((long)&local_3710._M_elems[0].stream + lVar8));
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x208);
    memset(&local_3810,0,0x100);
    local_3820 = tmp;
    while ((local_3810._M_elems[2] != 0 ||
           (fill<32U,_2U,_buffer_layout_bfs>::operator()
                      (&local_3829,&local_3710,local_3510,&local_3810), local_3810._M_elems[2] != 0)
           )) {
      if ((local_3810._M_elems[3] == 0) &&
         (fill<32U,_3U,_buffer_layout_bfs>::operator()
                    ((fill<32U,_3U,_buffer_layout_bfs> *)&local_3829,&local_3710,local_3510,
                     &local_3810), local_3810._M_elems[3] == 0)) {
        if (local_3810._M_elems[2] == 0) {
          __assert_fail("buffer_count[2] != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                        ,0x247,
                        "void fill_root(std::array<Stream, K> &__restrict, unsigned char **__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict) [K = 32U, BufferLayout = buffer_layout_bfs]"
                       );
        }
        while (uVar3 = local_3810._M_elems[2], local_3810._M_elems[2] != 0) {
          memmove(tmp,local_34d0 + -local_3810._M_elems[2],
                  (long)local_34d0 - (long)(local_34d0 + -local_3810._M_elems[2]));
          tmp = tmp + uVar3;
          local_3810._M_elems[2] = 0;
          fill<32U,_2U,_buffer_layout_bfs>::operator()
                    (&local_3829,&local_3710,local_3510,&local_3810);
        }
        goto LAB_001257b3;
      }
      uVar9 = local_3810._M_elems[3];
      uVar3 = local_3810._M_elems[2];
      __s1 = local_3510[8 - local_3810._M_elems[2]];
      if (__s1 == (uchar *)0x0) {
        __assert_fail("a != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                      ,0x5c,"int cmp(const unsigned char *, const unsigned char *)");
      }
      __s2 = (uchar *)local_34d0[8 - local_3810._M_elems[3]];
      if (__s2 == (uchar *)0x0) {
        __assert_fail("b != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                      ,0x5d,"int cmp(const unsigned char *, const unsigned char *)");
      }
      iVar4 = strcmp((char *)__s1,(char *)__s2);
      if (iVar4 < 1) {
        uVar9 = uVar3;
        __s2 = __s1;
      }
      *tmp = __s2;
      local_3810._M_elems[(ulong)(0 < iVar4) + 2] = uVar9 - 1;
      tmp = tmp + 1;
    }
    if (local_3810._M_elems[3] == 0) {
      __assert_fail("buffer_count[3] != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x239,
                    "void fill_root(std::array<Stream, K> &__restrict, unsigned char **__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict) [K = 32U, BufferLayout = buffer_layout_bfs]"
                   );
    }
    do {
      uVar3 = local_3810._M_elems[3];
      if (local_3810._M_elems[3] != 0) {
        if (local_3810._M_elems[3] * 8 != 0) {
          memmove(tmp,auStack_3490 + local_3810._M_elems[3] * -8,local_3810._M_elems[3] * 8);
        }
        tmp = tmp + uVar3;
        local_3810._M_elems[3] = 0;
        fill<32U,_3U,_buffer_layout_bfs>::operator()
                  ((fill<32U,_3U,_buffer_layout_bfs> *)&local_3829,&local_3710,local_3510,
                   &local_3810);
      }
    } while (uVar3 != 0);
LAB_001257b3:
    n0 = local_3818;
    ppuVar5 = local_3828;
    memcpy(local_3828,local_3820,local_3818 * 8);
    check_input(ppuVar5,n0);
  }
  return;
}

Assistant:

static void
funnelsort(unsigned char** strings, size_t n, unsigned char** restrict tmp)
{
	debug() << __func__ << "(), n=" << n << "\n";
	if (n < 32) {
		insertion_sort(strings, n, 0);
		return;
	}
	size_t splitter = n/K;
	std::array<Stream, K> streams;
	streams[0].stream = strings;
	streams[0].n      = splitter;
	for (unsigned i=1; i < K-1; ++i) {
		streams[i].stream = streams[i-1].stream + splitter;
		streams[i].n = splitter;
	}
	streams[K-1].stream = streams[K-2].stream + splitter;
	streams[K-1].n      = n - (K-1)*splitter;
	for (unsigned i=0; i < K; ++i) {
		funnelsort<(K>16?K/4:K/2),BufferLayout>(streams[i].stream,
		                                        streams[i].n, tmp);
		check_input(streams[i].stream, streams[i].n);
	}
	std::array<unsigned char*, buffer_total_size<K>::value> buffers;
	std::array<size_t, K> buffer_count;
	buffer_count.fill(0);
	fill_root<K,BufferLayout>(streams,tmp,buffers.data(),buffer_count);
	(void) memcpy(strings, tmp, n*sizeof(unsigned char*));
	check_input(strings, n);
}